

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O2

void __thiscall
duckdb::InvalidInputException::InvalidInputException<unsigned_int,unsigned_int>
          (InvalidInputException *this,string *msg,uint params,uint params_1)

{
  undefined4 in_register_00000014;
  uint in_R8D;
  string local_30;
  
  Exception::ConstructMessage<unsigned_int,unsigned_int>
            (&local_30,(Exception *)msg,(string *)CONCAT44(in_register_00000014,params),params_1,
             in_R8D);
  InvalidInputException(this,&local_30);
  ::std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

explicit InvalidInputException(const string &msg, ARGS... params)
	    : InvalidInputException(ConstructMessage(msg, params...)) {
	}